

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  int *piVar1;
  long *plVar2;
  undefined8 uVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  const_iterator cVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  long lVar10;
  size_type __n;
  ulong uVar11;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_248 [16];
  pointer local_238;
  VkAllocationCallbacks *pVStack_230;
  long local_220;
  VkDevice local_218;
  DeviceInterface *local_210;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  VkAllocationCallbacks *pVStack_1f0;
  deUint32 *local_1e8;
  Move<vk::Handle<(vk::HandleType)14>_> local_1d8;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection,&params->binaryName);
  lVar10 = *(long *)(cVar4._M_node + 2);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_208._0_4_ = 0x10;
  local_208._8_8_ = (DeviceInterface *)0x0;
  local_1f8 = (VkDevice)((ulong)local_1f8._4_4_ << 0x20);
  local_1e8 = *(deUint32 **)(lVar10 + 8);
  pVStack_1f0 = (VkAllocationCallbacks *)(*(long *)(lVar10 + 0x10) - (long)local_1e8);
  if (pVStack_1f0 == (VkAllocationCallbacks *)0x0) {
    local_1e8 = (deUint32 *)0x0;
  }
  ::vk::createShaderModule(&local_1d8,vk,device,(VkShaderModuleCreateInfo *)local_208,local_1a8);
  local_248._0_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_248._8_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_238 = (pointer)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_device;
  pVStack_230 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_248._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_248 + 8),
               (VkShaderModule)local_248._0_8_);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar5 = getSafeObjectCount(context,sVar6 - sVar5,0);
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  local_210 = Context::getDeviceInterface(context);
  local_218 = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection,&params->binaryName);
  local_220 = *(long *)(cVar4._M_node + 2);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
            *)local_248,__n,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)14>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18) + (int)local_1a8);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar5 != 0) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0x10;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0].pfnReallocation =
           (PFN_vkReallocationFunction)
           (*(long *)(local_220 + 0x10) - (long)*(PFN_vkFreeFunction *)(local_220 + 8));
      local_1a8[0].pfnFree = *(PFN_vkFreeFunction *)(local_220 + 8);
      if (local_1a8[0].pfnReallocation == (PFN_vkReallocationFunction)0x0) {
        local_1a8[0].pfnFree = (PFN_vkFreeFunction)0x0;
      }
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)local_208,local_210,local_218,
                 (VkShaderModuleCreateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
      pdVar8[2] = (deUint64)local_1f8;
      pdVar8[3] = (deUint64)pVStack_1f0;
      *pdVar8 = local_208._0_8_;
      pdVar8[1] = local_208._8_8_;
      local_208._0_8_ = 0;
      local_208._8_8_ = (DeviceInterface *)0x0;
      local_1f8 = (VkDevice)0x0;
      pVStack_1f0 = (VkAllocationCallbacks *)0x0;
      plVar9 = (long *)operator_new(0x20);
      uVar3 = local_248._0_8_;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d1dfd0;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)local_248._0_8_ + lVar10
                         );
      if (plVar2 != plVar9) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_248._0_8_ + lVar10 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)
                                           local_248._0_8_ + lVar10) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 +
                                    lVar10) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar10);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar10) = 0;
          }
        }
        *(deUint64 **)(uVar3 + lVar10 + -8) = pdVar8;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar10) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar10)
                        + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar2 = plVar9 + 1;
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      LOCK();
      piVar1 = (int *)((long)plVar9 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if (local_208._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_208 + 8),
                   (VkShaderModule)local_208._0_8_);
      }
      if ((uVar11 & 0x3ff) == 0 && uVar11 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while (__n != uVar11);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                     *)local_248,(pointer)local_248._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkShaderModuleCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
             *)local_248);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}